

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::begin_decoding(jpeg_decoder *this)

{
  int iVar1;
  jpeg_decoder *in_RDI;
  jpeg_decoder *this_00;
  int local_4;
  
  if ((in_RDI->m_ready_flag & 1U) == 0) {
    if (in_RDI->m_error_code == JPGD_SUCCESS) {
      this_00 = in_RDI;
      iVar1 = _setjmp((__jmp_buf_tag *)in_RDI);
      if (iVar1 == 0) {
        decode_start(this_00);
        in_RDI->m_ready_flag = true;
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int jpeg_decoder::begin_decoding() {
  if (m_ready_flag)
    return JPGD_SUCCESS;

  if (m_error_code)
    return JPGD_FAILED;

  if (setjmp(m_jmp_state))
    return JPGD_FAILED;

  decode_start();

  m_ready_flag = true;

  return JPGD_SUCCESS;
}